

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEdit::setTimeRange(QDateTimeEdit *this,QTime min,QTime max)

{
  QDateTimeEditPrivate *this_00;
  QDate date;
  char cVar1;
  QTime QVar2;
  long in_FS_OFFSET;
  undefined1 local_40 [16];
  int local_30;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  date.jd = *(qint64 *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  local_30 = max.mds;
  local_2c = min.mds;
  cVar1 = QTime::isValid();
  if (cVar1 != '\0') {
    cVar1 = QTime::isValid();
    if (cVar1 != '\0') {
      QVar2.mds = ::QVariant::toDate();
      this_00 = (QDateTimeEditPrivate *)(local_40 + 8);
      QDateTimeEditPrivate::dateTimeValue(this_00,date,QVar2);
      QVar2.mds = ::QVariant::toDate();
      QDateTimeEditPrivate::dateTimeValue((QDateTimeEditPrivate *)local_40,date,QVar2);
      setDateTimeRange(this,(QDateTime *)this_00,(QDateTime *)local_40);
      QDateTime::~QDateTime((QDateTime *)local_40);
      QDateTime::~QDateTime((QDateTime *)this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setTimeRange(QTime min, QTime max)
{
    Q_D(QDateTimeEdit);
    if (min.isValid() && max.isValid()) {
        setDateTimeRange(d->dateTimeValue(d->minimum.toDate(), min),
                         d->dateTimeValue(d->maximum.toDate(), max));
    }
}